

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::MergeConstPortVisitor::visit(MergeConstPortVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  long lVar2;
  Var *var;
  element_type *this_00;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Stmt *pSVar4;
  undefined4 extraout_var_03;
  Generator *pGVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  undefined1 __args [8];
  undefined1 local_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars_to_remove;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  undefined1 local_70 [8];
  value_type sink_stmt;
  value_type source_stmt;
  shared_ptr<kratos::StmtBlock> blk;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  Generator::get_vars_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,generator);
  vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars_to_remove
  ;
  vars_to_remove._M_t._M_impl._0_4_ = 0;
  vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&stmts_to_remove;
  stmts_to_remove._M_t._M_impl._0_4_ = 0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __args = local_f8;
  vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (__args == (undefined1  [8])
                  vars.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      p_Var6 = vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)&vars_to_remove) {
        do {
          Generator::remove_var(generator,(string *)(p_Var6 + 1));
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          p_Var7 = stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        } while (p_Var6 != (_Rb_tree_node_base *)&vars_to_remove);
      }
      for (; p_Var7 != (_Rb_tree_node_base *)&stmts_to_remove;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        Generator::remove_stmt(generator,(shared_ptr<kratos::Stmt> *)(p_Var7 + 1));
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   *)&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vars.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      return;
    }
    Generator::get_var((Generator *)
                       &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(string *)generator);
    if (((blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          [0x16]._M_use_count == 0) &&
        (iVar3 = (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base[0x10])(),
        *(long *)(CONCAT44(extraout_var,iVar3) + 0x18) == 1)) &&
       (iVar3 = (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi)->_vptr__Sp_counted_base[0xe])(),
       *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x18) == 1)) {
      iVar3 = (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base[0x10])();
      lVar2 = *(long *)(CONCAT44(extraout_var_01,iVar3) + 0x10);
      sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 8);
      source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar2 + 0x10);
      if (source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &((source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &((source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      iVar3 = (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base[0xe])();
      lVar2 = *(long *)(CONCAT44(extraout_var_02,iVar3) + 0x10);
      local_70 = *(undefined1 (*) [8])(lVar2 + 8);
      sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar2 + 0x10);
      if (sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &((sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &((sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      pSVar4 = Stmt::stmt_parent((Stmt *)sink_stmt.
                                         super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
      if ((pSVar4 == (Stmt *)0x0) || (pSVar4->type_ != Block)) {
LAB_0022dfff:
        lVar2 = *(long *)&sink_stmt.
                          super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[0xc]._M_use_count;
        if ((*(int *)(lVar2 + 0x168) == 3) &&
           (var = *(Var **)((long)local_70 + 0xc0), var->type_ == PortIO)) {
          iVar3 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var);
          pGVar5 = (Generator *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x20))
                             ((long *)CONCAT44(extraout_var_03,iVar3));
          if (pGVar5 == generator) {
            (*(var->super_IRNode)._vptr_IRNode[0x12])(var,0);
            Var::assign((Var *)&source_stmt.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,var,(AssignmentType)lVar2);
            this_00 = blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)source_stmt.
                         super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            Generator::add_stmt(generator,
                                (shared_ptr<kratos::Stmt> *)
                                &stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if (this_00 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base[0xf])
                      (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,local_70);
            (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base[0x13])
                      (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
                       &sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::
            _Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
            ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>&>
                      ((_Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                        *)&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (shared_ptr<kratos::AssignStmt> *)local_70);
            std::
            _Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
            ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>&>
                      ((_Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                        *)&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (shared_ptr<kratos::AssignStmt> *)
                       &sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&vars.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          }
        }
      }
      else {
        Stmt::as<kratos::StmtBlock>
                  ((Stmt *)&source_stmt.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        iVar3 = source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xd]._M_use_count;
        if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (iVar3 != 4) goto LAB_0022dfff;
      }
      if (sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   source_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    __args = (undefined1  [8])((long)__args + 0x20);
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        // scan each var that's one source and one sink, where the source is a constant
        // and the sink is a child generator instance input port
        auto const vars = generator->get_vars();
        std::set<std::string> vars_to_remove;
        std::set<std::shared_ptr<Stmt>> stmts_to_remove;

        for (auto const& var_name : vars) {
            auto const& var = generator->get_var(var_name);
            if (var->type() == VarType::Base && var->sources().size() == 1 &&
                var->sinks().size() == 1) {
                auto source_stmt = *(var->sources().begin());
                auto sink_stmt = *(var->sinks().begin());
                auto* src_stmt_parent = source_stmt->stmt_parent();
                if (src_stmt_parent && src_stmt_parent->type() == StatementType::Block) {
                    auto blk = src_stmt_parent->as<StmtBlock>();
                    if (blk->block_type() == StatementBlockType::Initial) {
                        // initial is allowed to have constant driver
                        continue;
                    }
                }
                auto* source_from = source_stmt->right();
                auto* sink_to = sink_stmt->left();
                if (source_from->type() == VarType::ConstValue &&
                    sink_to->type() == VarType::PortIO &&
                    sink_to->generator()->parent() == generator) {
                    sink_to->clear_sources(false);
                    generator->add_stmt(sink_to->assign(*source_from, AssignmentType::Blocking));
                    var->remove_sink(sink_stmt);
                    var->remove_source(source_stmt);
                    stmts_to_remove.emplace(sink_stmt);
                    stmts_to_remove.emplace(source_stmt);
                    vars_to_remove.emplace(var_name);
                }
            }
        }

        for (auto const& var_name : vars_to_remove) {
            generator->remove_var(var_name);
        }
        for (auto const& stmt : stmts_to_remove) {
            generator->remove_stmt(stmt);
        }
    }